

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O1

void __thiscall
TPZTensor<TFad<6,_double>_>::Multiply
          (TPZTensor<TFad<6,_double>_> *this,TPZTensor<TFad<6,_double>_> *tensor,
          TPZTensor<TFad<6,_double>_> *resp)

{
  TFad<6,_double> *pTVar1;
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *pTVar2;
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *pTVar3;
  int i_3;
  long lVar4;
  int i_9;
  int i_4;
  value_type vVar5;
  TFad<6,_double> XY;
  TFad<6,_double> XZ;
  TFad<6,_double> YZ;
  TFad<6,_double> XX;
  TFad<6,_double> YY;
  TFad<6,_double> ZZ;
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> local_200;
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> local_1f0;
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
  local_1e0;
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> local_1d0;
  TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>
  local_1c0;
  TFad<6,_double> local_1b0;
  TFad<6,_double> local_170;
  TFad<6,_double> local_130;
  TFad<6,_double> local_f0;
  TFad<6,_double> local_b0;
  TFad<6,_double> local_70;
  
  pTVar1 = (this->fData).super_TPZVec<TFad<6,_double>_>.fStore;
  local_f0.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TFad_0185d2b8;
  lVar4 = 2;
  do {
    local_f0.dx_[lVar4 + -2] = pTVar1->dx_[lVar4 + -2];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 8);
  local_f0.val_ = pTVar1->val_;
  local_b0.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TFad_0185d2b8;
  lVar4 = 0;
  do {
    local_b0.dx_[lVar4] = pTVar1[3].dx_[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 6);
  local_b0.val_ = pTVar1[3].val_;
  local_70.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TFad_0185d2b8;
  lVar4 = 0;
  do {
    local_70.dx_[lVar4] = pTVar1[5].dx_[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 6);
  local_70.val_ = pTVar1[5].val_;
  local_1b0.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TFad_0185d2b8;
  lVar4 = 2;
  do {
    local_1b0.dx_[lVar4 + -2] = pTVar1[1].dx_[lVar4 + -2];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 8);
  local_1b0.val_ = pTVar1[1].val_;
  local_170.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TFad_0185d2b8;
  lVar4 = 0;
  do {
    local_170.dx_[lVar4] = pTVar1[2].dx_[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 6);
  local_170.val_ = pTVar1[2].val_;
  local_130.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TFad_0185d2b8;
  lVar4 = 0;
  do {
    local_130.dx_[lVar4] = pTVar1[4].dx_[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 6);
  local_130.val_ = pTVar1[4].val_;
  local_1f0.fadexpr_.right_ = (tensor->fData).super_TPZVec<TFad<6,_double>_>.fStore;
  local_1f0.fadexpr_.left_ = &local_f0;
  local_1e0.fadexpr_.left_ = &local_1f0;
  local_200.fadexpr_.right_ = local_1f0.fadexpr_.right_ + 1;
  local_200.fadexpr_.left_ = &local_1b0;
  local_1e0.fadexpr_.right_ = &local_200;
  local_1c0.left_ = &local_1e0;
  local_1d0.fadexpr_.right_ = local_1f0.fadexpr_.right_ + 2;
  local_1d0.fadexpr_.left_ = &local_170;
  pTVar1 = (resp->fData).super_TPZVec<TFad<6,_double>_>.fStore;
  lVar4 = 0;
  local_1c0.right_ = &local_1d0;
  do {
    vVar5 = TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>
            ::dx(&local_1c0,(int)lVar4);
    pTVar1->dx_[lVar4] = vVar5;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 6);
  pTVar2 = ((local_1c0.left_)->fadexpr_).left_;
  pTVar3 = ((local_1c0.left_)->fadexpr_).right_;
  pTVar1->val_ = (((local_1c0.right_)->fadexpr_).left_)->val_ *
                 (((local_1c0.right_)->fadexpr_).right_)->val_ +
                 ((pTVar3->fadexpr_).left_)->val_ * ((pTVar3->fadexpr_).right_)->val_ +
                 ((pTVar2->fadexpr_).left_)->val_ * ((pTVar2->fadexpr_).right_)->val_;
  local_1d0.fadexpr_.right_ = (tensor->fData).super_TPZVec<TFad<6,_double>_>.fStore;
  local_1f0.fadexpr_.right_ = local_1d0.fadexpr_.right_ + 1;
  local_1f0.fadexpr_.left_ = &local_1b0;
  local_200.fadexpr_.right_ = local_1d0.fadexpr_.right_ + 3;
  local_200.fadexpr_.left_ = &local_b0;
  local_1e0.fadexpr_.left_ = &local_1f0;
  local_1e0.fadexpr_.right_ = &local_200;
  local_1d0.fadexpr_.right_ = local_1d0.fadexpr_.right_ + 4;
  local_1d0.fadexpr_.left_ = &local_130;
  local_1c0.left_ = &local_1e0;
  pTVar1 = (resp->fData).super_TPZVec<TFad<6,_double>_>.fStore;
  lVar4 = 0;
  local_1c0.right_ = &local_1d0;
  do {
    vVar5 = TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>
            ::dx(&local_1c0,(int)lVar4);
    pTVar1[3].dx_[lVar4] = vVar5;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 6);
  pTVar2 = ((local_1c0.left_)->fadexpr_).left_;
  pTVar3 = ((local_1c0.left_)->fadexpr_).right_;
  pTVar1[3].val_ =
       (((local_1c0.right_)->fadexpr_).left_)->val_ * (((local_1c0.right_)->fadexpr_).right_)->val_
       + ((pTVar3->fadexpr_).left_)->val_ * ((pTVar3->fadexpr_).right_)->val_ +
         ((pTVar2->fadexpr_).left_)->val_ * ((pTVar2->fadexpr_).right_)->val_;
  local_1d0.fadexpr_.right_ = (tensor->fData).super_TPZVec<TFad<6,_double>_>.fStore;
  local_1f0.fadexpr_.right_ = local_1d0.fadexpr_.right_ + 2;
  local_1f0.fadexpr_.left_ = &local_170;
  local_200.fadexpr_.right_ = local_1d0.fadexpr_.right_ + 4;
  local_200.fadexpr_.left_ = &local_130;
  local_1e0.fadexpr_.left_ = &local_1f0;
  local_1e0.fadexpr_.right_ = &local_200;
  local_1d0.fadexpr_.right_ = local_1d0.fadexpr_.right_ + 5;
  local_1d0.fadexpr_.left_ = &local_70;
  local_1c0.left_ = &local_1e0;
  pTVar1 = (resp->fData).super_TPZVec<TFad<6,_double>_>.fStore;
  lVar4 = 0;
  local_1c0.right_ = &local_1d0;
  do {
    vVar5 = TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>
            ::dx(&local_1c0,(int)lVar4);
    pTVar1[5].dx_[lVar4] = vVar5;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 6);
  pTVar2 = ((local_1c0.left_)->fadexpr_).left_;
  pTVar3 = ((local_1c0.left_)->fadexpr_).right_;
  pTVar1[5].val_ =
       (((local_1c0.right_)->fadexpr_).left_)->val_ * (((local_1c0.right_)->fadexpr_).right_)->val_
       + ((pTVar3->fadexpr_).left_)->val_ * ((pTVar3->fadexpr_).right_)->val_ +
         ((pTVar2->fadexpr_).left_)->val_ * ((pTVar2->fadexpr_).right_)->val_;
  local_1d0.fadexpr_.right_ = (tensor->fData).super_TPZVec<TFad<6,_double>_>.fStore;
  local_1f0.fadexpr_.right_ = local_1d0.fadexpr_.right_ + 1;
  local_1f0.fadexpr_.left_ = &local_f0;
  local_200.fadexpr_.right_ = local_1d0.fadexpr_.right_ + 3;
  local_200.fadexpr_.left_ = &local_1b0;
  local_1e0.fadexpr_.left_ = &local_1f0;
  local_1e0.fadexpr_.right_ = &local_200;
  local_1d0.fadexpr_.right_ = local_1d0.fadexpr_.right_ + 4;
  local_1d0.fadexpr_.left_ = &local_170;
  local_1c0.left_ = &local_1e0;
  pTVar1 = (resp->fData).super_TPZVec<TFad<6,_double>_>.fStore;
  lVar4 = 0;
  local_1c0.right_ = &local_1d0;
  do {
    vVar5 = TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>
            ::dx(&local_1c0,(int)lVar4);
    pTVar1[1].dx_[lVar4] = vVar5;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 6);
  pTVar2 = ((local_1c0.left_)->fadexpr_).left_;
  pTVar3 = ((local_1c0.left_)->fadexpr_).right_;
  pTVar1[1].val_ =
       (((local_1c0.right_)->fadexpr_).left_)->val_ * (((local_1c0.right_)->fadexpr_).right_)->val_
       + ((pTVar3->fadexpr_).left_)->val_ * ((pTVar3->fadexpr_).right_)->val_ +
         ((pTVar2->fadexpr_).left_)->val_ * ((pTVar2->fadexpr_).right_)->val_;
  local_1d0.fadexpr_.right_ = (tensor->fData).super_TPZVec<TFad<6,_double>_>.fStore;
  local_1f0.fadexpr_.right_ = local_1d0.fadexpr_.right_ + 2;
  local_1f0.fadexpr_.left_ = &local_f0;
  local_200.fadexpr_.right_ = local_1d0.fadexpr_.right_ + 4;
  local_200.fadexpr_.left_ = &local_1b0;
  local_1e0.fadexpr_.left_ = &local_1f0;
  local_1e0.fadexpr_.right_ = &local_200;
  local_1d0.fadexpr_.right_ = local_1d0.fadexpr_.right_ + 5;
  local_1d0.fadexpr_.left_ = &local_170;
  local_1c0.left_ = &local_1e0;
  pTVar1 = (resp->fData).super_TPZVec<TFad<6,_double>_>.fStore;
  lVar4 = 0;
  local_1c0.right_ = &local_1d0;
  do {
    vVar5 = TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>
            ::dx(&local_1c0,(int)lVar4);
    pTVar1[2].dx_[lVar4] = vVar5;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 6);
  pTVar2 = ((local_1c0.left_)->fadexpr_).left_;
  pTVar3 = ((local_1c0.left_)->fadexpr_).right_;
  pTVar1[2].val_ =
       (((local_1c0.right_)->fadexpr_).left_)->val_ * (((local_1c0.right_)->fadexpr_).right_)->val_
       + ((pTVar3->fadexpr_).left_)->val_ * ((pTVar3->fadexpr_).right_)->val_ +
         ((pTVar2->fadexpr_).left_)->val_ * ((pTVar2->fadexpr_).right_)->val_;
  local_1d0.fadexpr_.right_ = (tensor->fData).super_TPZVec<TFad<6,_double>_>.fStore;
  local_1f0.fadexpr_.right_ = local_1d0.fadexpr_.right_ + 2;
  local_1f0.fadexpr_.left_ = &local_1b0;
  local_200.fadexpr_.right_ = local_1d0.fadexpr_.right_ + 4;
  local_200.fadexpr_.left_ = &local_b0;
  local_1e0.fadexpr_.left_ = &local_1f0;
  local_1e0.fadexpr_.right_ = &local_200;
  local_1d0.fadexpr_.right_ = local_1d0.fadexpr_.right_ + 5;
  local_1d0.fadexpr_.left_ = &local_130;
  local_1c0.left_ = &local_1e0;
  pTVar1 = (resp->fData).super_TPZVec<TFad<6,_double>_>.fStore;
  lVar4 = 0;
  local_1c0.right_ = &local_1d0;
  do {
    vVar5 = TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>
            ::dx(&local_1c0,(int)lVar4);
    pTVar1[4].dx_[lVar4] = vVar5;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 6);
  pTVar2 = ((local_1c0.left_)->fadexpr_).left_;
  pTVar3 = ((local_1c0.left_)->fadexpr_).right_;
  pTVar1[4].val_ =
       (((local_1c0.right_)->fadexpr_).left_)->val_ * (((local_1c0.right_)->fadexpr_).right_)->val_
       + ((pTVar3->fadexpr_).left_)->val_ * ((pTVar3->fadexpr_).right_)->val_ +
         ((pTVar2->fadexpr_).left_)->val_ * ((pTVar2->fadexpr_).right_)->val_;
  return;
}

Assistant:

void TPZTensor<T>::Multiply(const TPZTensor<T> tensor, TPZTensor<T> & resp) const {
    const T XX = this->fData[_XX_];
    const T YY = this->fData[_YY_];
    const T ZZ = this->fData[_ZZ_];
    const T XY = this->fData[_XY_];
    const T XZ = this->fData[_XZ_];
    const T YZ = this->fData[_YZ_];
    resp.fData[_XX_] = XX * tensor.XX() + XY * tensor.XY() + XZ * tensor.XZ();
    resp.fData[_YY_] = XY * tensor.XY() + YY * tensor.YY() + YZ * tensor.YZ();
    resp.fData[_ZZ_] = XZ * tensor.XZ() + YZ * tensor.YZ() + ZZ * tensor.ZZ();
    resp.fData[_XY_] = XX * tensor.XY() + XY * tensor.YY() + XZ * tensor.YZ();
    resp.fData[_XZ_] = XX * tensor.XZ() + XY * tensor.YZ() + XZ * tensor.ZZ();
    resp.fData[_YZ_] = XY * tensor.XZ() + YY * tensor.YZ() + YZ * tensor.ZZ();
}